

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Select_Charmap(FT_Face face,FT_Encoding encoding)

{
  FT_CharMap *ppFVar1;
  FT_CharMap *ppFVar2;
  FT_CharMap pFVar3;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  if (encoding == FT_ENCODING_NONE) {
    return 6;
  }
  if (encoding != FT_ENCODING_UNICODE) {
    ppFVar1 = face->charmaps;
    if (ppFVar1 == (FT_CharMap *)0x0) {
      return 0x26;
    }
    if ((long)face->num_charmaps < 1) {
      return 6;
    }
    ppFVar2 = ppFVar1 + face->num_charmaps;
    do {
      if ((*ppFVar1)->encoding == encoding) {
        face->charmap = *ppFVar1;
        return 0;
      }
      ppFVar1 = ppFVar1 + 1;
    } while (ppFVar1 < ppFVar2);
    return 6;
  }
  ppFVar1 = face->charmaps;
  if (ppFVar1 == (FT_CharMap *)0x0) {
    return 0x26;
  }
  ppFVar2 = ppFVar1 + face->num_charmaps;
LAB_00134dfa:
  ppFVar2 = ppFVar2 + -1;
  if (ppFVar2 < ppFVar1) {
    ppFVar2 = ppFVar1 + face->num_charmaps;
    do {
      ppFVar2 = ppFVar2 + -1;
      if (ppFVar2 < ppFVar1) {
        return 0x26;
      }
      pFVar3 = *ppFVar2;
    } while (pFVar3->encoding != FT_ENCODING_UNICODE);
  }
  else {
    pFVar3 = *ppFVar2;
    if (pFVar3->encoding != FT_ENCODING_UNICODE) goto LAB_00134dfa;
    if (pFVar3->platform_id != 0) {
      if ((pFVar3->platform_id == 3) && (pFVar3->encoding_id == 10)) goto LAB_00134e56;
      goto LAB_00134dfa;
    }
    if (pFVar3->encoding_id != 4) goto LAB_00134dfa;
  }
LAB_00134e56:
  face->charmap = pFVar3;
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Select_Charmap( FT_Face      face,
                     FT_Encoding  encoding )
  {
    FT_CharMap*  cur;
    FT_CharMap*  limit;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( encoding == FT_ENCODING_NONE )
      return FT_THROW( Invalid_Argument );

    /* FT_ENCODING_UNICODE is special.  We try to find the `best' Unicode */
    /* charmap available, i.e., one with UCS-4 characters, if possible.   */
    /*                                                                    */
    /* This is done by find_unicode_charmap() above, to share code.       */
    if ( encoding == FT_ENCODING_UNICODE )
      return find_unicode_charmap( face );

    cur = face->charmaps;
    if ( !cur )
      return FT_THROW( Invalid_CharMap_Handle );

    limit = cur + face->num_charmaps;

    for ( ; cur < limit; cur++ )
    {
      if ( cur[0]->encoding == encoding )
      {
        face->charmap = cur[0];
        return 0;
      }
    }

    return FT_THROW( Invalid_Argument );
  }